

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testc.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Boolean BVar4;
  Integer in_RSI;
  undefined4 in_EDI;
  int nproc;
  int me;
  int stack;
  int heap;
  int in_stack_ffffffffffffffdc;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  
  uVar7 = 0;
  iVar6 = 20000;
  iVar5 = 20000;
  MPI_Init(&stack0xfffffffffffffff8,&stack0xfffffffffffffff0);
  GA_Initialize();
  iVar1 = GA_Nodeid();
  iVar2 = GA_Nnodes();
  if (iVar1 == 0) {
    iVar3 = GA_Uses_fapi();
    if (iVar3 != 0) {
      GA_Error((char *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffdc);
    }
    printf("Using %ld processes\n",(long)iVar2);
    fflush(_stdout);
  }
  BVar4 = MA_init(CONCAT44(uVar7,in_EDI),in_RSI,CONCAT44(iVar6 / iVar2,iVar5 / iVar2));
  if (BVar4 == 0) {
    GA_Error((char *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffdc);
  }
  do_work();
  if (iVar1 == 0) {
    printf("All tests successful\n");
  }
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
int heap=20000, stack=20000;
int me, nproc;

    MP_INIT(argc,argv);

    GA_INIT(argc,argv);                            /* initialize GA */
    me=GA_Nodeid(); 
    nproc=GA_Nnodes();
    if(me==0) {
       if(GA_Uses_fapi())GA_Error("Program runs with C array API only",1);
       printf("Using %ld processes\n",(long)nproc);
       fflush(stdout);
    }

    heap /= nproc;
    stack /= nproc;
    if(! MA_init(MT_F_DBL, stack, heap)) 
       GA_Error("MA_init failed",stack+heap);  /* initialize memory allocator*/ 
    
    do_work();

    if (me == 0) printf("All tests successful\n");

    GA_Terminate();
    MP_FINALIZE();

    return 0;
}